

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

char * __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::
AllocDecommitPages<BVStatic<272ul>,true>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,uint pageCount,
          BVStatic<272UL> freePages,BVStatic<272UL> decommitPages)

{
  PageBitVector *this_00;
  ulong *puVar1;
  undefined4 *puVar2;
  SecondaryAllocator *pSVar3;
  PageAllocatorBaseCommon *pPVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BVIndex BVar8;
  uint uVar9;
  int iVar10;
  BVIndex BVar11;
  uint uVar12;
  PreReservedVirtualAllocWrapper *this_01;
  char *pcVar13;
  long lVar14;
  AllocatorType *pAVar15;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_02;
  char *lpAddress;
  undefined8 *in_FS_OFFSET;
  undefined1 auStack_78 [8];
  BVStatic<272UL> freeAndDecommitPages;
  
  BVar11 = this->freePageCount;
  this_00 = &this->freePages;
  BVar8 = BVStatic<272UL>::Count(this_00);
  if (BVar11 != BVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x192,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar6) goto LAB_00264370;
    *puVar2 = 0;
  }
  BVar11 = this->decommitPageCount;
  BVar8 = BVStatic<272UL>::Count(&this->decommitPages);
  if (BVar11 != BVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x193,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar6) goto LAB_00264370;
    *puVar2 = 0;
  }
  uVar9 = this->decommitPageCount;
  if (uVar9 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x194,"(decommitPageCount != 0)","decommitPageCount != 0");
    if (!bVar6) goto LAB_00264370;
    *puVar2 = 0;
    uVar9 = this->decommitPageCount;
  }
  if (pageCount <= uVar9 + this->freePageCount) {
    pSVar3 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).secondaryAllocator;
    if ((pSVar3 != (SecondaryAllocator *)0x0) &&
       (iVar10 = (*pSVar3->_vptr_SecondaryAllocator[3])(), (char)iVar10 == '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x199,
                         "(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate())"
                         ,
                         "this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate()"
                        );
      if (!bVar6) {
LAB_00264370:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar2 = 0;
    }
    freeAndDecommitPages.data[3] = freePages.data[4];
    freeAndDecommitPages.data[1] = freePages.data[2];
    freeAndDecommitPages.data[2] = freePages.data[3];
    auStack_78 = (undefined1  [8])freePages.data[0].word;
    freeAndDecommitPages.data[0] = freePages.data[1];
    lVar14 = 0;
    do {
      puVar1 = (ulong *)((long)(freeAndDecommitPages.data + -1) + lVar14);
      *puVar1 = *puVar1 | *(ulong *)((long)&decommitPages.data[0].word + lVar14);
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x28);
    uVar9 = this->freePageCount;
    freeAndDecommitPages.data[4].word = (Type)&this->decommitPages;
    BVar11 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_78,0);
    if (BVar11 == 0xffffffff) {
      return (char *)0x0;
    }
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    do {
      pPVar4 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
               super_SegmentBaseCommon.allocator;
      pAVar15 = &pPVar4[-1].allocatorType;
      if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
        pAVar15 = (AllocatorType *)0x0;
      }
      if (pAVar15[0x28] <= BVar11) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar2 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x1a3,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar6) goto LAB_00264370;
        *puVar2 = 0;
      }
      uVar12 = GetAvailablePageCount(this);
      if (uVar12 - BVar11 < pageCount) {
        return (char *)0x0;
      }
      if ((pageCount == 1) ||
         (BVar7 = BVStatic<272UL>::TestRange((BVStatic<272UL> *)auStack_78,BVar11,pageCount),
         BVar7 != '\0')) {
        lpAddress = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address +
                    (BVar11 << 0xc);
        pPVar4 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                 super_SegmentBaseCommon.allocator;
        this_02 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                   *)&pPVar4[-1].allocatorType;
        if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
          this_02 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                     *)0x0;
        }
        this_01 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  ::GetVirtualAllocator(this_02);
        pPVar4 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                 super_SegmentBaseCommon.allocator;
        pAVar15 = &pPVar4[-1].allocatorType;
        if (pPVar4 == (PageAllocatorBaseCommon *)0x0) {
          pAVar15 = (AllocatorType *)0x0;
        }
        pcVar13 = (char *)PreReservedVirtualAllocWrapper::AllocPages
                                    (this_01,lpAddress,(ulong)pageCount,0x1000,4,pAVar15[0x50] == 2)
        ;
        if (pcVar13 != (char *)0x0) {
          if (pcVar13 != lpAddress) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar2 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x1be,"(ret == pages)","ret == pages");
            if (!bVar6) goto LAB_00264370;
            *puVar2 = 0;
          }
          BVStatic<272UL>::ClearRange(this_00,BVar11,pageCount);
          BVStatic<272UL>::ClearRange
                    ((BVStatic<272UL> *)freeAndDecommitPages.data[4].word,BVar11,pageCount);
          BVar11 = BVStatic<272UL>::Count(this_00);
          BVar8 = (this->freePageCount - uVar9) + BVar11;
          this->freePageCount = BVar8;
          this->decommitPageCount = this->decommitPageCount + (uVar9 - (BVar11 + pageCount));
          BVar11 = BVStatic<272UL>::Count(this_00);
          if (BVar8 != BVar11) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar2 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x1c7,"(freePageCount == (uint)this->GetCountOfFreePages())",
                               "freePageCount == (uint)this->GetCountOfFreePages()");
            if (!bVar6) goto LAB_00264370;
            *puVar2 = 0;
          }
          BVar11 = this->decommitPageCount;
          BVar8 = BVStatic<272UL>::Count((BVStatic<272UL> *)freeAndDecommitPages.data[4].word);
          if (BVar11 == BVar8) {
            return lpAddress;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar2 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x1c8,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                             "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
          if (bVar6) {
            *puVar2 = 0;
            return lpAddress;
          }
          goto LAB_00264370;
        }
        if (pageCount == 1) {
          return (char *)0x0;
        }
      }
      BVar11 = BVStatic<272UL>::GetNextBit((BVStatic<272UL> *)auStack_78,BVar11 + 1);
    } while (BVar11 != 0xffffffff);
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<TVirtualAlloc>::AllocDecommitPages(uint pageCount, T freePages, T decommitPages)
{
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    Assert(decommitPageCount ==  (uint)this->GetCountOfDecommitPages());
    Assert(decommitPageCount != 0);
    if (freePageCount + decommitPageCount < pageCount)
    {
        return nullptr;
    }
    Assert(this->secondaryAllocator == nullptr || this->secondaryAllocator->CanAllocate());

    T freeAndDecommitPages = freePages;

    freeAndDecommitPages.Or(&decommitPages);

    uint oldFreePageCount = freePageCount;
    uint index = freeAndDecommitPages.GetNextBit(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || freeAndDecommitPages.TestRange(index, pageCount))
        {
            char * pages = this->address + index * AutoSystemInfo::PageSize;

            if (!notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(pages, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = freeAndDecommitPages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            void * ret = this->GetAllocator()->GetVirtualAllocator()->AllocPages(pages, pageCount, MEM_COMMIT, PAGE_READWRITE, this->IsInCustomHeapAllocator());
            if (ret != nullptr)
            {
                Assert(ret == pages);

                this->ClearRangeInFreePagesBitVector(index, pageCount);
                this->ClearRangeInDecommitPagesBitVector(index, pageCount);

                uint newFreePageCount = this->GetCountOfFreePages();
                freePageCount = freePageCount - oldFreePageCount + newFreePageCount;
                decommitPageCount -= pageCount - (oldFreePageCount - newFreePageCount);

                Assert(freePageCount == (uint)this->GetCountOfFreePages());
                Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());

                return pages;
            }
            else if (pageCount == 1)
            {
                // if we failed to commit one page, we should just give up.
                return nullptr;
            }
        }
        index = freeAndDecommitPages.GetNextBit(index + 1);
    }

    return nullptr;
}